

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void glfwDestroyCursor(GLFWcursor *handle)

{
  _GLFWcursor *in_RDI;
  _GLFWcursor **prev;
  _GLFWwindow *window;
  _GLFWcursor *cursor;
  _GLFWcursor *local_20;
  _GLFWwindow *cursorHandle;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    cursorHandle = _glfw.windowListHead;
    if (in_RDI != (_GLFWcursor *)0x0) {
      for (; cursorHandle != (_GLFWwindow *)0x0; cursorHandle = cursorHandle->next) {
        if (cursorHandle->cursor == in_RDI) {
          glfwSetCursor((GLFWwindow *)in_RDI,(GLFWcursor *)cursorHandle);
        }
      }
      _glfwPlatformDestroyCursor((_GLFWcursor *)0x2dbb85);
      for (local_20 = (_GLFWcursor *)&_glfw.cursorListHead; local_20->next != in_RDI;
          local_20 = local_20->next) {
      }
      local_20->next = in_RDI->next;
      free(in_RDI);
    }
  }
  return;
}

Assistant:

GLFWAPI void glfwDestroyCursor(GLFWcursor* handle)
{
    _GLFWcursor* cursor = (_GLFWcursor*) handle;

    _GLFW_REQUIRE_INIT();

    if (cursor == NULL)
        return;

    // Make sure the cursor is not being used by any window
    {
        _GLFWwindow* window;

        for (window = _glfw.windowListHead;  window;  window = window->next)
        {
            if (window->cursor == cursor)
                glfwSetCursor((GLFWwindow*) window, NULL);
        }
    }

    _glfwPlatformDestroyCursor(cursor);

    // Unlink cursor from global linked list
    {
        _GLFWcursor** prev = &_glfw.cursorListHead;

        while (*prev != cursor)
            prev = &((*prev)->next);

        *prev = cursor->next;
    }

    free(cursor);
}